

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_os_rename(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val1;
  JSValue val1_00;
  JSValue JVar1;
  JSContext *ctx_00;
  char *__new;
  ssize_t sVar2;
  int ret;
  char *newpath;
  char *oldpath;
  undefined1 in_stack_ffffffffffffff88 [12];
  undefined4 in_stack_ffffffffffffff94;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined4 uStack_c;
  
  val1.tag._4_4_ = in_stack_ffffffffffffff94;
  val1._0_12_ = in_stack_ffffffffffffff88;
  ctx_00 = (JSContext *)JS_ToCString((JSContext *)0x114d62,val1);
  if (ctx_00 == (JSContext *)0x0) {
    local_30 = 0;
    local_28 = 6;
  }
  else {
    val1_00.tag._4_4_ = in_stack_ffffffffffffff94;
    val1_00._0_12_ = in_stack_ffffffffffffff88;
    __new = JS_ToCString((JSContext *)0x114d9c,val1_00);
    if (__new == (char *)0x0) {
      JS_FreeCString(ctx_00,(char *)0x0);
      local_30 = 0;
      local_28 = 6;
    }
    else {
      rename((char *)ctx_00,__new);
      sVar2 = js_get_errno(0x114de2);
      local_30 = (undefined4)sVar2;
      JS_FreeCString(ctx_00,__new);
      JS_FreeCString(ctx_00,__new);
      uStack_2c = uStack_c;
      local_28 = 0;
    }
  }
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_os_rename(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv)
{
    const char *oldpath, *newpath;
    int ret;
    
    oldpath = JS_ToCString(ctx, argv[0]);
    if (!oldpath)
        return JS_EXCEPTION;
    newpath = JS_ToCString(ctx, argv[1]);
    if (!newpath) {
        JS_FreeCString(ctx, oldpath);
        return JS_EXCEPTION;
    }
    ret = js_get_errno(rename(oldpath, newpath));
    JS_FreeCString(ctx, oldpath);
    JS_FreeCString(ctx, newpath);
    return JS_NewInt32(ctx, ret);
}